

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covec.cpp
# Opt level: O2

bool match(string *s,string *longarg,string *shortarg)

{
  __type _Var1;
  __type _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::string((string *)&bStack_68,(string *)s);
  _Var1 = std::operator==(&bStack_68,longarg);
  _Var2 = true;
  if (!_Var1) {
    std::__cxx11::string::string((string *)&local_48,(string *)s);
    _Var2 = std::operator==(&local_48,shortarg);
    std::__cxx11::string::~string((string *)&local_48);
  }
  std::__cxx11::string::~string((string *)&bStack_68);
  return _Var2;
}

Assistant:

inline bool match(const std::string& s, const std::string& longarg, const std::string& shortarg)
{ return std::string(s) == longarg || std::string(s) == shortarg; }